

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsSat.c
# Opt level: O2

int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *p)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  uint uVar4;
  ABC_INT64_T nConfLimit;
  long lVar5;
  sat_solver *s;
  char *__assertion;
  int Lits [12];
  
  iVar3 = p->nTotConfLim;
  uVar4 = 0xffffffff;
  if ((long)iVar3 == 0) {
    s = p->pSat;
    nConfLimit = 0;
  }
  else {
    s = p->pSat;
    lVar5 = (s->stats).conflicts;
    if (iVar3 <= lVar5) {
      return -1;
    }
    nConfLimit = (ABC_INT64_T)(iVar3 - (int)lVar5);
  }
  iVar3 = sat_solver_solve(s,(lit *)0x0,(lit *)0x0,nConfLimit,0,0,0);
  if (2 < iVar3 + 1U) {
    __assertion = "RetValue == l_Undef || RetValue == l_True || RetValue == l_False";
    uVar4 = 0x36;
LAB_00400e3f:
    __assert_fail(__assertion,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/opt/mfs/mfsSat.c"
                  ,uVar4,"int Abc_NtkMfsSolveSat_iter(Mfs_Man_t *)");
  }
  if (iVar3 != 0) {
    if (iVar3 == -1) {
      uVar4 = 0;
    }
    else {
      p->nCares = p->nCares + 1;
      pVVar2 = p->vProjVarsSat;
      iVar3 = pVVar2->nSize;
      uVar4 = 0;
      for (lVar5 = 0; lVar5 < iVar3; lVar5 = lVar5 + 1) {
        iVar1 = pVVar2->pArray[lVar5];
        Lits[lVar5] = iVar1 * 2;
        if (((long)iVar1 < 0) || (p->pSat->size <= iVar1)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/sat/bsat/satSolver.h"
                        ,0xda,"int sat_solver_var_value(sat_solver *, int)");
        }
        if (p->pSat->model[iVar1] == 1) {
          uVar4 = uVar4 | 1 << ((uint)lVar5 & 0x1f);
          Lits[lVar5] = iVar1 * 2 | 1;
        }
      }
      if ((p->uCare[(int)uVar4 >> 5] >> (uVar4 & 0x1f) & 1) != 0) {
        __assertion = "!Abc_InfoHasBit(p->uCare, Mint)";
        uVar4 = 0x4b;
        goto LAB_00400e3f;
      }
      p->uCare[(int)uVar4 >> 5] = p->uCare[(int)uVar4 >> 5] | 1 << ((byte)uVar4 & 0x1f);
      iVar3 = sat_solver_addclause(p->pSat,Lits,Lits + pVVar2->nSize);
      uVar4 = (uint)(iVar3 != 0);
    }
  }
  return uVar4;
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Enumerates through the SAT assignments.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
int Abc_NtkMfsSolveSat_iter( Mfs_Man_t * p )
{
    int Lits[MFS_FANIN_MAX];
    int RetValue, nBTLimit, iVar, b, Mint;
//    int nConfs = p->pSat->stats.conflicts;
    if ( p->nTotConfLim && p->nTotConfLim <= p->pSat->stats.conflicts )
        return -1;
    nBTLimit = p->nTotConfLim? p->nTotConfLim - p->pSat->stats.conflicts : 0;
    RetValue = sat_solver_solve( p->pSat, NULL, NULL, (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
    assert( RetValue == l_Undef || RetValue == l_True || RetValue == l_False );
//printf( "%c", RetValue==l_Undef ? '?' : (RetValue==l_False ? '-' : '+') );
//printf( "%d ", p->pSat->stats.conflicts-nConfs );
//if ( RetValue==l_False )
//printf( "\n" );
    if ( RetValue == l_Undef )
        return -1;
    if ( RetValue == l_False )
        return 0;
    p->nCares++;
    // add SAT assignment to the solver
    Mint = 0;
    Vec_IntForEachEntry( p->vProjVarsSat, iVar, b )
    {
        Lits[b] = toLit( iVar );
        if ( sat_solver_var_value( p->pSat, iVar ) )
        {
            Mint |= (1 << b);
            Lits[b] = lit_neg( Lits[b] );
        }
    }
    assert( !Abc_InfoHasBit(p->uCare, Mint) );
    Abc_InfoSetBit( p->uCare, Mint );
    // add the blocking clause
    RetValue = sat_solver_addclause( p->pSat, Lits, Lits + Vec_IntSize(p->vProjVarsSat) );
    if ( RetValue == 0 )
        return 0;
    return 1;
}